

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::crate::CrateReader::ReadStrings(CrateReader *this)

{
  long lVar1;
  pointer pSVar2;
  bool bVar3;
  
  lVar1 = this->_strings_index;
  if ((-1 < lVar1) &&
     (pSVar2 = (this->_toc).sections.
               super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
               ._M_impl.super__Vector_impl_data._M_start,
     lVar1 < (long)(this->_toc).sections.
                   super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 5)) {
    if (pSVar2[lVar1].size == 0) {
      return true;
    }
    if ((ulong)pSVar2[lVar1].start <= this->_sr->length_) {
      this->_sr->idx_ = pSVar2[lVar1].start;
      bVar3 = ReadIndices(this,&this->_string_indices);
      if (bVar3) {
        return true;
      }
    }
  }
  ::std::__cxx11::string::append((char *)&this->_err);
  return false;
}

Assistant:

bool CrateReader::ReadStrings() {
  if ((_strings_index < 0) ||
      (_strings_index >= int64_t(_toc.sections.size()))) {
    _err += "Invalid index for `STRINGS` section.\n";
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_strings_index)];

  if (s.size == 0) {
    // empty `STRINGS`?
    return true;
  }

  if (!_sr->seek_set(uint64_t(s.start))) {
    _err += "Failed to move to `STRINGS` section.\n";
    return false;
  }

  // `STRINGS` are not compressed.
  if (!ReadIndices(&_string_indices)) {
    _err += "Failed to read StringIndex array.\n";
    return false;
  }

  for (size_t i = 0; i < _string_indices.size(); i++) {
    DCOUT("StringIndex[" << i << "] = " << _string_indices[i].value);
  }

  return true;
}